

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

oonf_layer2_data *
oonf_layer2_neigh_query
          (char *ifname,netaddr *l2neigh_addr,oonf_layer2_neighbor_index idx,_Bool get_default)

{
  long lVar1;
  long lVar2;
  oonf_layer2_data *poVar3;
  bool bVar4;
  
  lVar1 = avl_find(&_oonf_layer2_net_tree,ifname);
  if (lVar1 != 0) {
    lVar2 = avl_find(lVar1 + -0x710);
    if ((lVar2 == 0) || (*(long *)(lVar2 + -0x3f0 + (ulong)idx * 0x28) == 0)) {
      if (!get_default) {
        return (oonf_layer2_data *)0x0;
      }
    }
    else {
      lVar2 = lVar2 + (ulong)idx * 0x28;
      poVar3 = (oonf_layer2_data *)(lVar2 + -0x410);
      bVar4 = *(long *)(lVar2 + -0x3f8) == 0;
      if (bVar4) {
        poVar3 = (oonf_layer2_data *)0x0;
      }
      if (!bVar4 || !get_default) {
        return poVar3;
      }
    }
    if (*(long *)(lVar1 + -0x3f0 + (ulong)idx * 0x28) != 0) {
      lVar1 = lVar1 + (ulong)idx * 0x28;
      if (*(long *)(lVar1 + -0x3f8) == 0) {
        return (oonf_layer2_data *)0x0;
      }
      return (oonf_layer2_data *)(lVar1 + -0x410);
    }
  }
  return (oonf_layer2_data *)0x0;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_query(const char *ifname, const struct netaddr *l2neigh_addr,
      enum oonf_layer2_neighbor_index idx, bool get_default) {
  struct oonf_layer2_net *l2net;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_data *data;

  /* query layer2 database about neighbor */
  l2net = oonf_layer2_net_get(ifname);
  if (l2net == NULL) {
    return NULL;
  }

  /* look for neighbor specific data */
  l2neigh = oonf_layer2_neigh_get(l2net, l2neigh_addr);
  if (l2neigh != NULL) {
    data = &l2neigh->data[idx];
    if (oonf_layer2_data_has_value(data)) {
      return data;
    }
  }

  if (!get_default) {
    return NULL;
  }

  /* look for network specific default */
  data = &l2net->neighdata[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }
  return NULL;
}